

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool __thiscall AActor::AdjustReflectionAngle(AActor *this,AActor *thing,DAngle *angle)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  AActor *pAVar4;
  TAngle<double> local_90;
  TAngle<double> local_88;
  TAngle<double> local_80;
  TAngle<double> local_78;
  TAngle<double> local_70;
  TAngle<double> local_68;
  TAngle<double> local_60;
  TAngle<double> local_58;
  TFlags<ActorFlag7,_unsigned_int> local_4c;
  TFlags<ActorFlag4,_unsigned_int> local_48;
  TFlags<ActorFlag7,_unsigned_int> local_44;
  TAngle<double> local_40;
  TFlags<ActorFlag4,_unsigned_int> local_34;
  TFlags<ActorFlag7,_unsigned_int> local_30;
  TFlags<ActorFlag2,_unsigned_int> local_2c;
  DAngle *local_28;
  DAngle *angle_local;
  AActor *thing_local;
  AActor *this_local;
  
  local_28 = angle;
  angle_local = (DAngle *)thing;
  thing_local = this;
  TFlags<ActorFlag2,_unsigned_int>::operator&
            (&local_2c,(int)this + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
  uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
  if (uVar2 == 0) {
    TFlags<ActorFlag7,_unsigned_int>::operator&
              (&local_30,
               (int)angle_local +
               (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|MF7_ALWAYSTELEFRAG));
    uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_30);
    if (uVar2 == 0) {
      TFlags<ActorFlag4,_unsigned_int>::operator&
                (&local_34,
                 (int)angle_local +
                 (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
      uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_34);
      if (uVar2 == 0) {
        TFlags<ActorFlag4,_unsigned_int>::operator&
                  (&local_48,
                   (int)angle_local +
                   (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
        uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_48);
        if (uVar2 == 0) {
          iVar3 = FRandom::operator()(&pr_reflect);
          TAngle<double>::operator+=(local_28,(double)(iVar3 % 0x10 + -8));
        }
        else {
          iVar3 = FRandom::operator()(&pr_reflect);
          if (iVar3 < 0x80) {
            TAngle<double>::operator+=(local_28,45.0);
          }
          else {
            TAngle<double>::operator-=(local_28,45.0);
          }
        }
      }
      else {
        absangle<double>(&local_40,local_28);
        bVar1 = TAngle<double>::operator>(&local_40,45.0);
        if (bVar1) {
          return true;
        }
        TFlags<ActorFlag7,_unsigned_int>::operator&
                  (&local_44,
                   (int)angle_local +
                   (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|MF7_ALWAYSTELEFRAG));
        uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
        if (uVar2 != 0) {
          return true;
        }
        iVar3 = FRandom::operator()(&pr_reflect);
        if (iVar3 < 0x80) {
          TAngle<double>::operator+=(local_28,45.0);
        }
        else {
          TAngle<double>::operator-=(local_28,45.0);
        }
      }
      TFlags<ActorFlag7,_unsigned_int>::operator&
                (&local_4c,
                 (int)angle_local +
                 (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|MF7_ALWAYSTELEFRAG));
      uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
      if (uVar2 != 0) {
        bVar1 = TObjPtr<AActor>::operator!=(&this->target,(AActor *)0x0);
        if (bVar1) {
          pAVar4 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
          TAngle<double>::TAngle(&local_58,0.0);
          TAngle<double>::TAngle(&local_60,270.0);
          TAngle<double>::TAngle(&local_68,0.0);
          TAngle<double>::TAngle(&local_70,0.0);
          A_Face(this,pAVar4,&local_58,&local_60,&local_68,&local_70,0,0.0);
        }
        else {
          bVar1 = TObjPtr<AActor>::operator!=((TObjPtr<AActor> *)(angle_local + 0x41),(AActor *)0x0)
          ;
          if (bVar1) {
            pAVar4 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)(angle_local + 0x41));
            TAngle<double>::TAngle(&local_78,0.0);
            TAngle<double>::TAngle(&local_80,270.0);
            TAngle<double>::TAngle(&local_88,0.0);
            TAngle<double>::TAngle(&local_90,0.0);
            A_Face(this,pAVar4,&local_78,&local_80,&local_88,&local_90,0,0.0);
          }
        }
      }
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AActor::AdjustReflectionAngle (AActor *thing, DAngle &angle)
{
	if (flags2 & MF2_DONTREFLECT) return true;
	if (thing->flags7 & MF7_THRUREFLECT) return false;
	// Change angle for reflection
	if (thing->flags4&MF4_SHIELDREFLECT)
	{
		// Shield reflection (from the Centaur)
		if (absangle(angle, thing->Angles.Yaw) > 45)
			return true;	// Let missile explode

		if (thing->flags7 & MF7_NOSHIELDREFLECT) return true;

		if (pr_reflect () < 128)
			angle += 45;
		else
			angle -= 45;

	}
	else if (thing->flags4&MF4_DEFLECT)
	{
		// deflect (like the Heresiarch)
		if(pr_reflect() < 128) 
			angle += 45;
		else 
			angle -= 45;
	}
	else
	{
		angle += ((pr_reflect() % 16) - 8);
	}
	//Always check for AIMREFLECT, no matter what else is checked above.
	if (thing->flags7 & MF7_AIMREFLECT)
	{
		if (this->target != NULL)
		{
			A_Face(this, this->target);
		}
		else if (thing->target != NULL)
		{
			A_Face(this, thing->target);
		}
	}
	
	return false;
}